

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_new_game.hpp
# Opt level: O3

uint32_t __thiscall PatchNewGame::inject_func_init_game(PatchNewGame *this,ROM *rom,World *world)

{
  World *pWVar1;
  uint32_t uVar2;
  pointer puVar3;
  pointer puVar4;
  ushort uVar5;
  ulong uVar6;
  vector<unsigned_char,_std::allocator<unsigned_char>_> flag_array;
  Code func_init_game;
  string local_100;
  Param local_e0;
  undefined8 local_d8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_d0;
  ROM *local_b8;
  World *local_b0;
  Code local_a8;
  
  local_b8 = rom;
  local_b0 = world;
  build_flag_array(&local_d0,this,world);
  local_a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header;
  local_a8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0
  ;
  local_a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_a8._labels._M_t._M_impl.super__Rb_tree_header._M_header;
  local_a8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_a8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_a8._labels._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_a8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_a8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_a8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar6 = 0;
    puVar3 = local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar4 = local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    do {
      uVar5 = *(ushort *)(puVar3 + uVar6) << 8 | *(ushort *)(puVar3 + uVar6) >> 8;
      if (uVar5 != 0) {
        local_e0._vptr_Param = (_func_int **)&PTR_getXn_00262cd8;
        local_d8 = CONCAT44(2,(int)uVar6 + 0xff1000);
        local_100._M_dataplus._M_p = (pointer)&PTR_getXn_00262c98;
        local_100._M_string_length._0_4_ = (uint)uVar5;
        local_100._M_string_length._4_4_ = 1;
        md::Code::move(&local_a8,(Param *)&local_100,&local_e0,WORD);
        puVar3 = local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        puVar4 = local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      }
      uVar6 = uVar6 + 2;
    } while (uVar6 < (ulong)((long)puVar4 - (long)puVar3));
  }
  pWVar1 = local_b0;
  local_e0._vptr_Param = (_func_int **)&PTR_getXn_00262cd8;
  local_d8 = 0x200ff1206;
  local_100._M_dataplus._M_p = (pointer)&PTR_getXn_00262c98;
  local_100._M_string_length._0_4_ = (uint)local_b0->_spawn_map_id;
  local_100._M_string_length._4_4_ = 1;
  md::Code::move(&local_a8,(Param *)&local_100,&local_e0,WORD);
  local_e0._vptr_Param = (_func_int **)&PTR_getXn_00262cd8;
  local_d8 = 0x200ff5404;
  local_100._M_dataplus._M_p = (pointer)&PTR_getXn_00262c98;
  local_100._M_string_length._0_4_ = (uint)pWVar1->_spawn_orientation;
  local_100._M_string_length._4_4_ = 0;
  md::Code::move(&local_a8,(Param *)&local_100,&local_e0,BYTE);
  local_e0._vptr_Param = (_func_int **)&PTR_getXn_00262cd8;
  local_d8 = 0x200ff120e;
  local_100._M_dataplus._M_p = (pointer)&PTR_getXn_00262c98;
  local_100._M_string_length._0_4_ = (uint)pWVar1->_starting_golds;
  local_100._M_string_length._4_4_ = 1;
  md::Code::move(&local_a8,(Param *)&local_100,&local_e0,WORD);
  md::Code::rts(&local_a8);
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"");
  uVar2 = md::ROM::inject_code(local_b8,&local_a8,&local_100);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_100._M_dataplus._M_p != &local_100.field_2) {
    operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree(&local_a8._labels._M_t);
  std::
  _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_a8._pending_branches._M_t);
  if (local_a8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8._bytes.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a8._bytes.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8._bytes.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_d0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return uVar2;
}

Assistant:

[[nodiscard]] uint32_t inject_func_init_game(md::ROM& rom, const World& world) const
    {
        std::vector<uint8_t> flag_array = build_flag_array(world);

        md::Code func_init_game;
        {
            // Init all flags with the contents of flag_array
            for(int i = 0 ; i < flag_array.size() ; i += 0x2)
            {
                uint16_t value = (static_cast<uint16_t>(flag_array[i]) << 8) + static_cast<uint16_t>(flag_array[i + 1]);
                if(value)
                    func_init_game.movew(value, addr_(0xFF1000 + i));
            }

            // Set the "parent map" value to the same value as "current map" so that dialogues work on spawn map
            func_init_game.movew(world.spawn_map_id(), addr_(0xFF1206));
            // Set the orientation byte of Nigel depending on spawn location on game start
            func_init_game.moveb(world.spawn_orientation(), addr_(0xFF5404));
            // Set the appropriate starting golds
            func_init_game.movew(world.starting_golds(), addr_(0xFF120E));
        }
        func_init_game.rts();

        return rom.inject_code(func_init_game);
    }